

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.hpp
# Opt level: O2

void __thiscall
mir::inst::LoadOffsetInst::LoadOffsetInst(LoadOffsetInst *this,Value *src,VarId *dest,Value *offset)

{
  uint32_t uVar1;
  
  uVar1 = dest->id;
  (this->super_Inst).dest.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
  (this->super_Inst).dest.id = uVar1;
  (this->super_Inst).super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001db238;
  Value::Value(&this->src,src);
  Value::Value(&this->offset,offset);
  return;
}

Assistant:

LoadOffsetInst(Value src, VarId dest, Value offset = 0)
      : src(src), Inst(dest), offset(offset) {}